

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_Ofs8_Data16(VGMPlayer *this)

{
  CHIP_DEVICE *pCVar1;
  
  pCVar1 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar1 != (CHIP_DEVICE *)0x0) && (pCVar1->writeD16 != (DEVFUNC_WRITE_A8D16)0x0)) {
    (*pCVar1->writeD16)((pCVar1->base).defInf.dataPtr,
                        this->_fileData[(ulong)this->_filePos + 1] & 0x7f,
                        *(UINT16 *)(this->_fileData + (ulong)this->_filePos + 2));
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Ofs8_Data16(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeD16 == NULL)
		return;
	
	UINT16 value = ReadLE16(&fData[0x02]);
	cDev->writeD16(cDev->base.defInf.dataPtr, fData[0x01] & 0x7F, value);
	return;
}